

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.cc
# Opt level: O2

JsonObjectWriter * __thiscall
google::protobuf::util::converter::JsonObjectWriter::RenderUint64
          (JsonObjectWriter *this,StringPiece name,uint64 value)

{
  stringpiece_ssize_type sVar1;
  AlphaNum *a;
  StringPiece s;
  AlphaNum local_78;
  string local_48;
  
  WritePrefix(this,name);
  WriteChar(this,'\"');
  strings::AlphaNum::AlphaNum(&local_78,value);
  StrCat_abi_cxx11_(&local_48,(protobuf *)&local_78,a);
  sVar1 = StringPiece::CheckedSsizeTFromSizeT(local_48._M_string_length);
  s.length_ = sVar1;
  s.ptr_ = local_48._M_dataplus._M_p;
  WriteRawString(this,s);
  std::__cxx11::string::~string((string *)&local_48);
  WriteChar(this,'\"');
  return this;
}

Assistant:

JsonObjectWriter* JsonObjectWriter::RenderUint64(StringPiece name,
                                                 uint64 value) {
  WritePrefix(name);
  WriteChar('"');
  WriteRawString(StrCat(value));
  WriteChar('"');
  return this;
}